

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpulseGenerator.cpp
# Opt level: O2

int ImpulseGenerator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  uint uVar1;
  int i;
  EffectData *pEVar2;
  ulong uVar3;
  uint uVar4;
  Random *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<ImpulseGenerator::EffectData>(state);
  if (((state->field_0).field_0.flags & 7) == 1) {
    this = &(pEVar2->field_0).data.random;
    uVar4 = 0;
    uVar1 = outchannels;
    if (outchannels < 1) {
      uVar1 = uVar4;
    }
    for (; uVar4 != length; uVar4 = uVar4 + 1) {
      fVar5 = (pEVar2->field_0).data.samplesleft + -1.0;
      (pEVar2->field_0).data.samplesleft = fVar5;
      if (fVar5 <= 0.0) {
        fVar5 = (pEVar2->field_0).data.p[4];
        fVar6 = Random::GetFloat(this,0.0,(pEVar2->field_0).data.p[5]);
        fVar8 = 0.0;
        fVar6 = fVar6 + fVar5;
        if (0.0 < fVar6) {
          fVar8 = powf(0.001,1000.0 / (fVar6 * (float)(state->field_0).field_0.samplerate));
        }
        (pEVar2->field_0).data.decay = fVar8;
        fVar5 = (pEVar2->field_0).data.p[2];
        fVar6 = Random::GetFloat(this,0.0,(pEVar2->field_0).data.p[3]);
        (pEVar2->field_0).data.level = fVar6 + fVar5;
        fVar5 = (pEVar2->field_0).data.samplesleft;
        fVar6 = (pEVar2->field_0).data.p[0];
        fVar8 = Random::GetFloat(this,0.0,(pEVar2->field_0).data.p[1]);
        fVar5 = (float)(state->field_0).field_0.samplerate * (fVar8 + fVar6) * 0.001 + fVar5;
        (pEVar2->field_0).data.samplesleft = (ABS(0.0 - fVar5) + fVar5 + 0.0) * 0.5;
      }
      fVar7 = Random::GetFloat(this,-1.0,1.0);
      fVar5 = (pEVar2->field_0).data.level;
      fVar6 = (pEVar2->field_0).data.p[6];
      fVar8 = (pEVar2->field_0).data.p[7];
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        outbuffer[uVar3] = inbuffer[uVar3] + (fVar7 * fVar5 - fVar5) * fVar8 + fVar6 * fVar7 + fVar5
        ;
      }
      (pEVar2->field_0).data.level = (pEVar2->field_0).data.decay * (pEVar2->field_0).data.level;
      outbuffer = outbuffer + outchannels;
      inbuffer = inbuffer + inchannels;
    }
  }
  else {
    memset(outbuffer,0,(long)outchannels * (ulong)length * 4);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0 || (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused)) != 0)
        {
            memset(outbuffer, 0, sizeof(float) * length * outchannels);
            return UNITY_AUDIODSP_OK;
        }

        for (unsigned int n = 0; n < length; n++)
        {
            data->samplesleft -= 1.0f;
            if (data->samplesleft <= 0.0f)
            {
                float decaytime = data->p[P_BASEDECAY] + data->random.GetFloat(0.0f, data->p[P_RANDOMDECAY]);
                data->decay = (decaytime <= 0.0f) ? 0.0f : powf(0.001f, 1000.0f / (state->samplerate * decaytime));
                data->level = data->p[P_BASEAMP] + data->random.GetFloat(0.0f, data->p[P_RANDOMAMP]);
                data->samplesleft = FastMax(0.0f, data->samplesleft + (data->p[P_BASEPERIOD] + data->random.GetFloat(0.0f, data->p[P_RANDOMPERIOD])) * 0.001f * state->samplerate);
            }
            float noise = data->random.GetFloat(-1.0f, 1.0f);
            float s = noise * data->p[P_NOISEADD] + data->level + data->p[P_NOISEMIX] * (noise * data->level - data->level);
            for (int i = 0; i < outchannels; i++)
                outbuffer[i] = inbuffer[i] + s;
            inbuffer += inchannels;
            outbuffer += outchannels;
            data->level *= data->decay;
        }

        return UNITY_AUDIODSP_OK;
    }